

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O0

Signature __thiscall
wasm::anon_unknown_24::HeapTypeGeneratorImpl::generateSignature(HeapTypeGeneratorImpl *this)

{
  bool bVar1;
  uint32_t uVar2;
  reference pTVar3;
  Type TVar4;
  Type results;
  Type params;
  Type *type;
  iterator __end2;
  iterator __begin2;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *__range2;
  allocator<wasm::Type> local_39;
  undefined1 local_38 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> types;
  HeapTypeGeneratorImpl *this_local;
  
  types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  uVar2 = Random::upToSquared(this->rand,(this->params).MAX_PARAMS);
  std::allocator<wasm::Type>::allocator(&local_39);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_38,(ulong)uVar2,&local_39);
  std::allocator<wasm::Type>::~allocator(&local_39);
  __end2 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::begin
                     ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_38);
  type = (Type *)std::vector<wasm::Type,_std::allocator<wasm::Type>_>::end
                           ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
                                *)&type);
    if (!bVar1) break;
    pTVar3 = __gnu_cxx::
             __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
             ::operator*(&__end2);
    TVar4 = generateSingleType(this,Unshared);
    pTVar3->id = TVar4.id;
    __gnu_cxx::
    __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::
    operator++(&__end2);
  }
  TVar4.id = wasm::TypeBuilder::getTempTupleType((vector *)this->builder);
  results = generateReturnType(this);
  Signature::Signature((Signature *)&this_local,TVar4,results);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_38);
  return _this_local;
}

Assistant:

Signature generateSignature() {
    std::vector<Type> types(rand.upToSquared(params.MAX_PARAMS));
    for (auto& type : types) {
      type = generateSingleType(Unshared);
    }
    auto params = builder.getTempTupleType(types);
    return {params, generateReturnType()};
  }